

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O2

void ArgumentCheck(string *identifier_name,int line_number,int character_number,
                  vector<_SymbolType,_std::allocator<_SymbolType>_> *value_argument_type)

{
  LogTools *pLVar1;
  bool bVar2;
  int __val;
  ulong uVar3;
  ulong uVar4;
  int __val_00;
  vector<_SymbolType,_std::allocator<_SymbolType>_> argument_type;
  string str2;
  string str1;
  _Vector_base<_SymbolType,_std::allocator<_SymbolType>_> local_108;
  vector<_SymbolType,_std::allocator<_SymbolType>_> *local_e8;
  ulong local_e0;
  string *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = FunctionTable::Find(handle_func_table,identifier_name);
  if (bVar2) {
    local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FunctionTable::GetTermArgumentType
              (handle_func_table,identifier_name,
               (vector<_SymbolType,_std::allocator<_SymbolType>_> *)&local_108);
    pLVar1 = g_log_tools;
    uVar3 = (ulong)((long)local_108._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_108._M_impl.super__Vector_impl_data._M_start) >> 2;
    __val = (int)uVar3;
    __val_00 = (int)((ulong)((long)(value_argument_type->
                                   super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(value_argument_type->
                                  super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
    if (__val == __val_00) {
      uVar4 = 0;
      uVar3 = uVar3 & 0xffffffff;
      if (__val < 1) {
        uVar3 = uVar4;
      }
      local_e8 = value_argument_type;
      local_e0 = uVar3;
      local_d8 = identifier_name;
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        if (local_108._M_impl.super__Vector_impl_data._M_start[uVar4] !=
            (value_argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>).
            _M_impl.super__Vector_impl_data._M_start[uVar4]) {
          std::__cxx11::string::string
                    ((string *)&local_b0,
                     symbol_type_string[local_108._M_impl.super__Vector_impl_data._M_start[uVar4]],
                     (allocator *)&local_d0);
          std::__cxx11::string::string
                    ((string *)&local_d0,
                     symbol_type_string
                     [(value_argument_type->
                      super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar4]],(allocator *)&local_50);
          pLVar1 = g_log_tools;
          std::operator+(&local_90,"argument expected: ",&local_b0);
          std::operator+(&local_70,&local_90,", but value argument had: ");
          std::operator+(&local_50,&local_70,&local_d0);
          LogTools::SemanticErrorLogs(pLVar1,&local_50,local_d8,line_number,character_number);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_b0);
          uVar3 = local_e0;
          value_argument_type = local_e8;
        }
      }
    }
    else {
      std::__cxx11::to_string(&local_70,__val);
      std::operator+(&local_50,"argument list expected: ",&local_70);
      std::operator+(&local_d0,&local_50,", but value argument list had: ");
      std::__cxx11::to_string(&local_90,__val_00);
      std::operator+(&local_b0,&local_d0,&local_90);
      LogTools::SemanticErrorLogs(pLVar1,&local_b0,identifier_name,line_number,character_number);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::_Vector_base<_SymbolType,_std::allocator<_SymbolType>_>::~_Vector_base(&local_108);
  }
  return;
}

Assistant:

void ArgumentCheck(const string& identifier_name, int line_number, int character_number, vector<SymbolType>& value_argument_type) {
    if (!handle_func_table->Find(identifier_name)) {
        return;
    }
    vector<SymbolType> argument_type;
    handle_func_table->GetTermArgumentType(identifier_name, argument_type);
    int argument_type_len = argument_type.size();
    int value_argument_type_len = value_argument_type.size();
    if (argument_type_len != value_argument_type_len) {
        g_log_tools->SemanticErrorLogs("argument list expected: " + std::to_string(argument_type_len) + ", but value argument list had: "
                + std::to_string(value_argument_type_len), identifier_name, line_number, character_number);
        return;
    }
    for (int i=0; i<value_argument_type_len; ++i) {
        if (argument_type[i] != value_argument_type[i]) {
            string str1 = symbol_type_string[argument_type[i]];
            string str2 = symbol_type_string[value_argument_type[i]];
            g_log_tools->SemanticErrorLogs("argument expected: " + str1 + ", but value argument had: " + str2, identifier_name, line_number, character_number);
        }
    }
}